

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall xla::GraphCycles::RemoveNode(GraphCycles *this,int32_t node)

{
  bool bVar1;
  reference this_00;
  vector<int,_std::allocator<int>_> *pvVar2;
  reference piVar3;
  reference pvVar4;
  const_iterator cStack_58;
  int32_t y_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  const_iterator cStack_38;
  int32_t y;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  NodeIO *x;
  GraphCycles *pGStack_10;
  int32_t node_local;
  GraphCycles *this_local;
  
  x._4_4_ = node;
  pGStack_10 = this;
  this_00 = std::
            vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
            ::operator[](&this->rep_->node_io_,(long)node);
  pvVar2 = OrderedSet<int>::GetSequence(&this_00->out);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
  cStack_38 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    pvVar4 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)*piVar3);
    OrderedSet<int>::Erase(&pvVar4->in,x._4_4_);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  pvVar2 = OrderedSet<int>::GetSequence(&this_00->in);
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar2);
  cStack_58 = std::vector<int,_std::allocator<int>_>::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffffa8);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1_1);
    pvVar4 = std::
             vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ::operator[](&this->rep_->node_io_,(long)*piVar3);
    OrderedSet<int>::Erase(&pvVar4->out,x._4_4_);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  OrderedSet<int>::Clear(&this_00->in);
  OrderedSet<int>::Clear(&this_00->out);
  std::vector<int,_std::allocator<int>_>::push_back
            (&this->rep_->free_nodes_,(value_type_conflict1 *)((long)&x + 4));
  return;
}

Assistant:

void GraphCycles::RemoveNode(int32_t node) {
  NodeIO* x = &rep_->node_io_[node];
  for (int32_t y : x->out.GetSequence()) {
    rep_->node_io_[y].in.Erase(node);
  }
  for (int32_t y : x->in.GetSequence()) {
    rep_->node_io_[y].out.Erase(node);
  }
  x->in.Clear();
  x->out.Clear();
  rep_->free_nodes_.push_back(node);
}